

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O1

bool asio::detail::reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform
               (reactor_op *base)

{
  bool bVar1;
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1> bufs;
  buf local_18;
  size_t local_8;
  
  local_18.iov_base = base[1].super_operation.func_;
  local_18.iov_len = *(size_t *)&base[1].super_operation.task_result_;
  local_8 = local_18.iov_len;
  bVar1 = socket_ops::non_blocking_recv
                    (*(socket_type *)&base[1].super_operation.next_,&local_18,1,base[1].ec_._M_value
                     ,(bool)((*(byte *)((long)&base[1].super_operation.next_ + 4) & 0x10) >> 4),
                     &base->ec_,&base->bytes_transferred_);
  return bVar1;
}

Assistant:

static bool do_perform(reactor_op* base)
  {
    reactive_socket_recv_op_base* o(
        static_cast<reactive_socket_recv_op_base*>(base));

    buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs(o->buffers_);

    bool result = socket_ops::non_blocking_recv(o->socket_,
        bufs.buffers(), bufs.count(), o->flags_,
        (o->state_ & socket_ops::stream_oriented) != 0,
        o->ec_, o->bytes_transferred_);

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_recv",
          o->ec_, o->bytes_transferred_));

    return result;
  }